

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O1

BOOL __thiscall
Js::PathTypeHandlerBase::SetPropertyInternal<true>
          (PathTypeHandlerBase *this,DynamicObject *instance,PropertyId propertyId,
          PropertyIndex index,Var value,ObjectSlotAttributes attr,PropertyValueInfo *info,
          PropertyOperationFlags flags,SideEffects possibleSideEffects,bool isInit)

{
  ScriptContext *pSVar1;
  ThreadContext *pTVar2;
  Type *pTVar3;
  code *pcVar4;
  ObjectSlotAttributes OVar5;
  bool bVar6;
  int iVar7;
  BOOL BVar8;
  undefined4 *puVar9;
  undefined4 extraout_var;
  PathTypeHandlerBase *this_00;
  DynamicTypeHandler *pDVar10;
  undefined4 extraout_var_00;
  undefined7 in_register_00000089;
  uint32 local_44;
  Var pvStack_40;
  uint32 indexVal;
  undefined4 local_34;
  
  local_34 = (undefined4)CONCAT71(in_register_00000089,attr);
  pvStack_40 = value;
  if (0xf < (uint)propertyId && value == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0x31d,"(value != nullptr || IsInternalPropertyId(propertyId))",
                                "value != nullptr || IsInternalPropertyId(propertyId)");
    if (!bVar6) goto LAB_00dd959f;
    *puVar9 = 0;
  }
  pSVar1 = (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
           super_JavascriptLibraryBase).scriptContext.ptr;
  bVar6 = Phases::IsEnabled((Phases *)&DAT_015bbe90,IsConcatSpreadableCachePhase);
  if ((propertyId == 0x13) && (!bVar6)) {
    Output::Trace(IsConcatSpreadableCachePhase,L"IsConcatSpreadableCache invalidated\n");
    pTVar2 = pSVar1->threadContext;
    (pTVar2->isConcatSpreadableCache).type0 = (Type *)0x0;
    (pTVar2->isConcatSpreadableCache).type1 = (Type *)0x0;
  }
  pTVar3 = (instance->super_RecyclableObject).type.ptr;
  if (index == 0xffff) {
    BVar8 = ScriptContext::IsNumericPropertyId
                      ((((pTVar3->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                       scriptContext.ptr,propertyId,&local_44);
    OVar5 = (ObjectSlotAttributes)local_34;
    if (BVar8 == 0) {
      BVar8 = AddPropertyInternal(this,instance,propertyId,pvStack_40,(ObjectSlotAttributes)local_34
                                  ,info,flags,possibleSideEffects);
    }
    else if ((ObjectSlotAttributes)local_34 == ObjectSlotAttr_Default) {
      BVar8 = DynamicTypeHandler::SetItem
                        (&this->super_DynamicTypeHandler,instance,local_44,pvStack_40,
                         PropertyOperation_None);
    }
    else {
      iVar7 = (*(this->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x48])(this,instance);
      BVar8 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar7) + 0x170))
                        ((long *)CONCAT44(extraout_var_00,iVar7),instance,local_44,pvStack_40,
                         OVar5 & ObjectSlotAttr_PropertyAttributesMask);
    }
  }
  else {
    if ((*(char *)((long)&pTVar3[1].javascriptLibrary.ptr + 1) == '\x01') &&
       (((this->super_DynamicTypeHandler).flags & 0x10) == 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                  ,0x327,
                                  "(!instance->GetDynamicType()->GetIsShared() || GetIsShared())",
                                  "!instance->GetDynamicType()->GetIsShared() || GetIsShared()");
      if (!bVar6) {
LAB_00dd959f:
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      *puVar9 = 0;
    }
    iVar7 = (*(this->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x6b])(this);
    OVar5 = (ObjectSlotAttributes)local_34;
    BVar8 = SetAttributesHelper(this,instance,propertyId,index,
                                (ObjectSlotAttributes *)CONCAT44(extraout_var,iVar7),
                                (ObjectSlotAttributes)local_34,true);
    if (BVar8 == 0) {
      pDVar10 = DynamicObject::GetTypeHandler(instance);
      BVar8 = (*pDVar10->_vptr_DynamicTypeHandler[0x3a])
                        (pDVar10,instance,(ulong)(uint)propertyId,pvStack_40,(ulong)OVar5,info,
                         (ulong)flags,(ulong)possibleSideEffects);
    }
    else {
      this_00 = FromTypeHandler(*(DynamicTypeHandler **)
                                 ((instance->super_RecyclableObject).type.ptr + 1));
      SetSlotAndCache(this_00,instance,propertyId,(PropertyRecord *)0x0,index,pvStack_40,info,flags,
                      possibleSideEffects);
      BVar8 = 1;
    }
  }
  return BVar8;
}

Assistant:

BOOL PathTypeHandlerBase::SetPropertyInternal(DynamicObject* instance, PropertyId propertyId, PropertyIndex index, Var value, ObjectSlotAttributes attr, PropertyValueInfo* info, PropertyOperationFlags flags, SideEffects possibleSideEffects, bool isInit)
    {
        PathTypeHandlerBase *newTypeHandler = nullptr;

        // Path type handler doesn't support pre-initialization (PropertyOperation_PreInit). Pre-initialized properties
        // will get marked as fixed when pre-initialized and then as non-fixed when their actual values are set.

        Assert(value != nullptr || IsInternalPropertyId(propertyId));

        JavascriptLibrary::CheckAndInvalidateIsConcatSpreadableCache(propertyId, instance->GetScriptContext());

        if (index != Constants::NoSlot)
        {
            // If type is shared then the handler must be shared as well.  This is a weaker invariant than in AddPropertyInternal,
            // because the type coming in here may be the result of DynamicObject::ChangeType(). In that case the handler may have
            // already been shared, but the newly created type isn't - and likely never will be - shared (is typically unreachable).
            // In CacheOperators::CachePropertyWrite we ensure that we never cache property adds for types that aren't shared.
            Assert(!instance->GetDynamicType()->GetIsShared() || GetIsShared());

            bool setAttrDone;
            if (setAttributes)
            {
                setAttrDone = this->SetAttributesHelper(instance, propertyId, index, GetAttributeArray(), attr, true);
                if (!setAttrDone)
                {
                    return instance->GetTypeHandler()->SetPropertyWithAttributes(instance, propertyId, value, attr, info, flags, possibleSideEffects);
                }
            }
            else if (isInit)
            {
                ObjectSlotAttributes * attributes = this->GetAttributeArray();
                if (attributes && (attributes[index] & ObjectSlotAttr_Accessor))
                {
                    setAttrDone = this->SetAttributesHelper(instance, propertyId, index, attributes, (ObjectSlotAttributes)(attributes[index] & ~ObjectSlotAttr_Accessor), true);
                    if (!setAttrDone)
                    {
                        return instance->GetTypeHandler()->InitProperty(instance, propertyId, value, flags, info);
                    }
                    // We're changing an accessor into a data property at object init time. Don't cache this transition from setter to non-setter,
                    // as it behaves differently from a normal set property.
                    PropertyValueInfo::SetNoCache(info, instance);
                    newTypeHandler = PathTypeHandlerBase::FromTypeHandler(instance->GetDynamicType()->GetTypeHandler());
                    newTypeHandler->SetSlotUnchecked(instance, index, value);
                    return true;
                }
            }
            newTypeHandler = PathTypeHandlerBase::FromTypeHandler(instance->GetDynamicType()->GetTypeHandler());
            newTypeHandler->SetSlotAndCache(instance, propertyId, nullptr, index, value, info, flags, possibleSideEffects);
            return true;
        }

        // Always check numeric propertyId. This may create an objectArray.
        ScriptContext* scriptContext = instance->GetScriptContext();
        uint32 indexVal;
        if (scriptContext->IsNumericPropertyId(propertyId, &indexVal))
        {
            if (setAttributes)
            {
                if (attr != ObjectSlotAttr_Default)
                {
                    return this->ConvertToTypeWithItemAttributes(instance)->SetItemWithAttributes(instance, indexVal, value, ObjectSlotAttributesToPropertyAttributes(attr));
                }
            }
            return PathTypeHandlerBase::SetItem(instance, indexVal, value, PropertyOperation_None);
        }

        return PathTypeHandlerBase::AddPropertyInternal(instance, propertyId, value, attr, info, flags, possibleSideEffects);
    }